

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_replacement_pass.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::ScalarReplacementPass::CheckUses(ScalarReplacementPass *this,Instruction *inst)

{
  bool bVar1;
  bool ok;
  VariableStats stats;
  Instruction *inst_local;
  ScalarReplacementPass *this_local;
  
  stats = (VariableStats)inst;
  memset(&stack0xffffffffffffffe0,0,8);
  bVar1 = CheckUses(this,(Instruction *)stats,(VariableStats *)&stack0xffffffffffffffe0);
  return bVar1;
}

Assistant:

bool ScalarReplacementPass::CheckUses(const Instruction* inst) const {
  VariableStats stats = {0, 0};
  bool ok = CheckUses(inst, &stats);

  // TODO(alanbaker/greg-lunarg): Add some meaningful heuristics about when
  // SRoA is costly, such as when the structure has many (unaccessed?)
  // members.

  return ok;
}